

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  char cVar1;
  If_Obj_t *pIVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  float *pfVar6;
  void *pvVar7;
  Mio_Library_t *pLib;
  long lVar8;
  If_Man_t *pIfMan;
  If_DsdMan_t *pIVar9;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar10;
  Vec_Int_t *vCover;
  int *piVar11;
  ProgressBar *p;
  Vec_Ptr_t *pVVar12;
  If_Par_t *pIVar13;
  char *pcVar14;
  Abc_Ntk_t *pAVar15;
  Abc_NtkFunc_t Func;
  long lVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x70,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
  }
  pfVar6 = Abc_NtkGetCiArrivalFloats(pNtk);
  pPars->pTimesArr = pfVar6;
  pfVar6 = Abc_NtkGetCoRequiredFloats(pNtk);
  pPars->pTimesReq = pfVar6;
  if (((((pPars->fDelayOpt != 0) || (pPars->fDsdBalance != 0)) || (pPars->fUserRecLib != 0)) ||
      (pPars->fUserSesLib != 0)) && (pNtk->pManTime != (Abc_ManTime_t *)0x0)) {
    if ((pNtk->AndGateDelay == 0.0) && (!NAN(pNtk->AndGateDelay))) {
      pvVar7 = Abc_FrameReadLibGen();
      if (pvVar7 == (void *)0x0) {
        fVar17 = pNtk->AndGateDelay;
      }
      else {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        fVar17 = Mio_LibraryReadDelayAigNode(pLib);
        pNtk->AndGateDelay = fVar17;
      }
      if ((fVar17 == 0.0) && (!NAN(fVar17))) {
        pNtk->AndGateDelay = 1.0;
        puts("The AIG-node delay is not set. Assuming unit-delay.");
      }
    }
    lVar8 = (long)pNtk->vCis->nSize;
    if (0 < lVar8) {
      pfVar6 = pPars->pTimesArr;
      lVar16 = 0;
      do {
        pfVar6[lVar16] = pfVar6[lVar16] / pNtk->AndGateDelay;
        lVar16 = lVar16 + 1;
      } while (lVar8 != lVar16);
    }
    lVar8 = (long)pNtk->vCos->nSize;
    if (0 < lVar8) {
      pfVar6 = pPars->pTimesReq;
      lVar16 = 0;
      do {
        pfVar6[lVar16] = pfVar6[lVar16] / pNtk->AndGateDelay;
        lVar16 = lVar16 + 1;
      } while (lVar8 != lVar16);
    }
  }
  auVar3 = _DAT_0094e250;
  if ((pPars->fLatchPaths != 0) && (pfVar6 = pPars->pTimesArr, pfVar6 != (float *)0x0)) {
    iVar5 = pNtk->vPis->nSize;
    if (0 < (long)iVar5) {
      lVar8 = (long)iVar5 + -1;
      auVar18._8_4_ = (int)lVar8;
      auVar18._0_8_ = lVar8;
      auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar18 = auVar18 ^ _DAT_0094e250;
      auVar19 = _DAT_0094f530;
      auVar20 = _DAT_0094e240;
      do {
        auVar21 = auVar20 ^ auVar3;
        iVar4 = auVar18._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar4 && auVar18._0_4_ < auVar21._0_4_ ||
                    iVar4 < auVar21._4_4_) & 1)) {
          *(undefined4 *)((long)pfVar6 + lVar8) = 0xce6e6b28;
        }
        if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
            auVar21._12_4_ <= auVar18._12_4_) {
          *(undefined4 *)((long)pfVar6 + lVar8 + 4) = 0xce6e6b28;
        }
        auVar21 = auVar19 ^ auVar3;
        iVar22 = auVar21._4_4_;
        if (iVar22 <= iVar4 && (iVar22 != iVar4 || auVar21._0_4_ <= auVar18._0_4_)) {
          *(undefined4 *)((long)pfVar6 + lVar8 + 8) = 0xce6e6b28;
          *(undefined4 *)((long)pfVar6 + lVar8 + 0xc) = 0xce6e6b28;
        }
        lVar16 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar16 + 4;
        lVar16 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 4;
        auVar19._8_8_ = lVar16 + 4;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(iVar5 + 3U >> 2) << 4 != lVar8);
    }
  }
  pIfMan = Abc_NtkToIf(pNtk,pPars);
  if (pIfMan == (If_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (pPars->fPower != 0) {
    If_ManComputeSwitching(pIfMan);
  }
  if (pPars->fUseDsd == 0) goto LAB_002d549e;
  pIVar9 = (If_DsdMan_t *)Abc_FrameReadManDsd();
  iVar5 = pPars->nLutSize;
  iVar4 = If_DsdManVarNum(pIVar9);
  if (iVar4 < iVar5) {
    __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0x9d,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
  }
  pcVar14 = pPars->pLutStruct;
  if (pcVar14 == (char *)0x0) {
    iVar5 = If_DsdManLutSize(pIVar9);
    if (iVar5 != 0) {
      pcVar14 = pPars->pLutStruct;
      if (pcVar14 == (char *)0x0) goto LAB_002d5823;
      goto LAB_002d5466;
    }
  }
  else {
LAB_002d5466:
    cVar1 = *pcVar14;
    iVar5 = If_DsdManLutSize(pIVar9);
    if (cVar1 + -0x30 != iVar5) {
LAB_002d5823:
      __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x9e,"Abc_Ntk_t *Abc_NtkIf(Abc_Ntk_t *, If_Par_t *)");
    }
  }
  pIVar9 = (If_DsdMan_t *)Abc_FrameReadManDsd();
  pIfMan->pIfDsdMan = pIVar9;
  if (pPars->fDsdBalance != 0) {
    If_DsdManAllocIsops(pIVar9,pPars->nLutSize);
  }
LAB_002d549e:
  iVar5 = If_ManPerformMapping(pIfMan);
  if (iVar5 == 0) {
    If_ManStop(pIfMan);
  }
  else {
    pIVar13 = pIfMan->pPars;
    Func = ABC_FUNC_BDD;
    if ((((pIVar13->fUseBdds == 0) && (pIVar13->fUseCnfs == 0)) && (pIVar13->fUseMv == 0)) &&
       ((Func = ABC_FUNC_SOP, pIVar13->fUseSops == 0 && (pIVar13->fUserSesLib == 0)))) {
      Func = (uint)(pIVar13->nGateSize < 1) * 2 + ABC_FUNC_SOP;
    }
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,Func);
    If_ManCleanNodeCopy(pIfMan);
    If_ManCleanCutData(pIfMan);
    pIVar2 = pIfMan->pConst1;
    pAVar10 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pIVar2->field_22).pCopy = pAVar10;
    pVVar12 = pNtk->vCis;
    if (0 < pVVar12->nSize) {
      lVar8 = 0;
      do {
        if (pIfMan->vCis->nSize <= lVar8) goto LAB_002d57e5;
        *(undefined8 *)((long)pIfMan->vCis->pArray[lVar8] + 0x40) =
             *(undefined8 *)((long)pVVar12->pArray[lVar8] + 0x40);
        lVar8 = lVar8 + 1;
        pVVar12 = pNtk->vCis;
      } while (lVar8 < pVVar12->nSize);
    }
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar11 = (int *)malloc(0x40000);
    vCover->pArray = piVar11;
    p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    pVVar12 = pNtk->vCos;
    if (0 < pVVar12->nSize) {
      lVar8 = 0;
      do {
        pvVar7 = pVVar12->pArray[lVar8];
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar8)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar8,"Final");
        }
        if (pIfMan->vCos->nSize <= lVar8) {
LAB_002d57e5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar10 = Abc_NodeFromIf_rec(pNtk_00,pIfMan,
                                     *(If_Obj_t **)((long)pIfMan->vCos->pArray[lVar8] + 0x18),vCover
                                    );
        if (pIfMan->vCos->nSize <= lVar8) goto LAB_002d57e5;
        Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar7 + 0x40),
                        (Abc_Obj_t *)
                        ((ulong)(*pIfMan->vCos->pArray[lVar8] >> 4 & 1) ^ (ulong)pAVar10));
        lVar8 = lVar8 + 1;
        pVVar12 = pNtk->vCos;
      } while (lVar8 < pVVar12->nSize);
    }
    Extra_ProgressBarStop(p);
    if (vCover->pArray != (int *)0x0) {
      free(vCover->pArray);
    }
    free(vCover);
    pAVar10 = (Abc_Obj_t *)(pIfMan->pConst1->field_22).pCopy;
    if (((pAVar10->vFanouts).nSize == 0) && ((pAVar10->field_0x14 & 0xf) != 0)) {
      Abc_NtkDeleteObj(pAVar10);
    }
    pIVar13 = pIfMan->pPars;
    if (((pIVar13->fUseBdds != 0) || (pIVar13->fUseCnfs != 0)) || (pIVar13->fUseMv != 0)) {
      Abc_NtkSweep(pNtk_00,0);
      pIVar13 = pIfMan->pPars;
      if (pIVar13->fUseBdds != 0) {
        Abc_NtkBddReorder(pNtk_00,0);
        pIVar13 = pIfMan->pPars;
      }
    }
    iVar5 = Abc_NtkLogicMakeSimpleCos(pNtk_00,(uint)(pIVar13->fUseBuffs == 0));
    if (((iVar5 != 0) && (pIfMan->pPars->fVerbose != 0)) &&
       (pcVar14 = Abc_FrameReadFlag("silentmode"), pcVar14 == (char *)0x0)) {
      pcVar14 = "Added %d buffers/inverters to decouple the CO drivers.\n";
      if (pIfMan->pPars->fUseBuffs == 0) {
        pcVar14 = "Duplicated %d gates to decouple the CO drivers.\n";
      }
      printf(pcVar14);
    }
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      If_ManStop(pIfMan);
      if (((pPars->fDelayOpt == 0) && (pPars->fDsdBalance == 0)) && (pPars->fUserRecLib == 0)) {
        if ((pPars->fBidec != 0) && (pPars->nLutSize < 9)) {
          Abc_NtkBidecResyn(pNtk_00,0);
        }
      }
      else {
        pAVar15 = Abc_NtkStrash(pNtk_00,0,0,0);
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = pAVar15;
      }
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar15 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar15;
      }
      iVar5 = Abc_NtkCheck(pNtk_00);
      if (iVar5 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkIf: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    If_Man_t * pIfMan;

    assert( Abc_NtkIsStrash(pNtk) );

    // get timing information
    pPars->pTimesArr = Abc_NtkGetCiArrivalFloats(pNtk);
    pPars->pTimesReq = Abc_NtkGetCoRequiredFloats(pNtk);

    // update timing info to reflect logic level
    if ( (pPars->fDelayOpt || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib) && pNtk->pManTime )
    {
        int c;
        if ( pNtk->AndGateDelay == 0.0 )
        {
            if ( Abc_FrameReadLibGen() )
                pNtk->AndGateDelay = Mio_LibraryReadDelayAigNode((Mio_Library_t *)Abc_FrameReadLibGen());
            if ( pNtk->AndGateDelay == 0.0 )
            {
                pNtk->AndGateDelay = 1.0;
                printf( "The AIG-node delay is not set. Assuming unit-delay.\n" );
            }
        }
        for ( c = 0; c < Abc_NtkCiNum(pNtk); c++ )
            pPars->pTimesArr[c] /= pNtk->AndGateDelay;
        for ( c = 0; c < Abc_NtkCoNum(pNtk); c++ )
            pPars->pTimesReq[c] /= pNtk->AndGateDelay;
    }

    // set the latch paths
    if ( pPars->fLatchPaths && pPars->pTimesArr )
    {
        int c;
        for ( c = 0; c < Abc_NtkPiNum(pNtk); c++ )
            pPars->pTimesArr[c] = -ABC_INFINITY;
    }

    // create FPGA mapper
    pIfMan = Abc_NtkToIf( pNtk, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    if ( pPars->fPower )
        If_ManComputeSwitching( pIfMan );

    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }

    // perform FPGA mapping
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }

    // transform the result of mapping into the new network
    pNtkNew = Abc_NtkFromIf( pIfMan, pNtk );
    if ( pNtkNew == NULL )
        return NULL;
    If_ManStop( pIfMan );
    if ( pPars->fDelayOpt || pPars->fDsdBalance || pPars->fUserRecLib )
    {
        pNtkNew = Abc_NtkStrash( pTemp = pNtkNew, 0, 0, 0 );
        Abc_NtkDelete( pTemp );
    }
    else if ( pPars->fBidec && pPars->nLutSize <= 8 )
        Abc_NtkBidecResyn( pNtkNew, 0 );

    // duplicate EXDC
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkIf: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}